

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

void ibuf_dequeue(msgbuf *msgbuf,ibuf *buf)

{
  long *in_RSI;
  long in_RDI;
  
  if (*in_RSI == 0) {
    *(long *)(in_RDI + 8) = in_RSI[1];
  }
  else {
    *(long *)(*in_RSI + 8) = in_RSI[1];
  }
  *(long *)in_RSI[1] = *in_RSI;
  if ((int)in_RSI[7] != -1) {
    close((int)in_RSI[7]);
  }
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
  ibuf_free((ibuf *)0x108be6);
  return;
}

Assistant:

void
ibuf_dequeue(struct msgbuf *msgbuf, struct ibuf *buf)
{
	TAILQ_REMOVE(&msgbuf->bufs, buf, entry);

	if (buf->fd != -1)
		close(buf->fd);

	msgbuf->queued--;
	ibuf_free(buf);
}